

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

uint __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntryCount(cmELFInternalImpl<cmELFTypes32> *this)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar3 = LoadDynamicSection(this);
  uVar4 = 0;
  if (bVar3) {
    paVar1 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)paVar2 - (long)paVar1 >> 3;
    if (paVar2 != paVar1) {
      uVar4 = 0;
      do {
        if (paVar1[uVar4].d_tag == 0) goto LAB_002e1289;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 < uVar5);
    }
    uVar4 = uVar5 & 0xffffffff;
  }
LAB_002e1289:
  return (uint)uVar4;
}

Assistant:

unsigned int cmELFInternalImpl<Types>::GetDynamicEntryCount()
{
  if(!this->LoadDynamicSection())
    {
    return 0;
    }
  for(unsigned int i = 0; i < this->DynamicSectionEntries.size(); ++i)
    {
    if(this->DynamicSectionEntries[i].d_tag == DT_NULL)
      {
      return i;
      }
    }
  return static_cast<unsigned int>(this->DynamicSectionEntries.size());
}